

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::impl::surplus_send_pairing
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *surpluses,int p,int rank,bool send_deficit)

{
  long *plVar1;
  pointer puVar2;
  int iVar3;
  long lVar4;
  pointer plVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  fifo;
  pair<int,_long> local_b0;
  int local_9c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  ulong local_90;
  ulong local_88;
  _Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_80;
  
  local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)p,(value_type_conflict2 *)&local_80,
             (allocator_type *)&local_b0);
  std::
  queue<std::pair<int,long>,std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>>::
  queue<std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>,void>
            ((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
              *)&local_80);
  local_90 = (ulong)(uint)rank;
  uVar7 = 0;
  local_9c = rank;
  local_88 = (ulong)(uint)p;
  if (p < 1) {
    local_88 = uVar7;
  }
  do {
    if (uVar7 == local_88) {
      if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
        assert_fail("fifo.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                    ,0xbd,"surplus_send_pairing");
      }
      std::_Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~_Deque_base
                (&local_80);
      return local_98;
    }
    plVar5 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = plVar5[uVar7];
    if (lVar4 != 0) {
      iVar6 = (int)uVar7;
      if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_b0.first = iVar6;
        local_b0.second = lVar4;
        std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
        emplace_back<std::pair<int,long>>
                  ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_80,
                   &local_b0);
      }
      else if (lVar4 < 1) {
        if ((local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second < 0) {
          local_b0.first = iVar6;
          local_b0.second = lVar4;
          std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
          emplace_back<std::pair<int,long>>
                    ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_80,
                     &local_b0);
        }
        else {
          bVar11 = uVar7 == local_90;
          while (lVar4 < 0) {
            if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
              local_b0.first = iVar6;
              local_b0.second = lVar4;
              std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
              emplace_back<std::pair<int,long>>
                        ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_80
                         ,&local_b0);
              break;
            }
            lVar10 = (local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
            lVar9 = -lVar4;
            if (SBORROW8(lVar10,-lVar4) != lVar10 + lVar4 < 0) {
              lVar9 = lVar10;
            }
            iVar3 = (local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
            plVar5[uVar7] = lVar4 + lVar9;
            plVar1 = &(local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
            *plVar1 = *plVar1 - lVar9;
            if (*plVar1 == 0) {
              std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::pop_front
                        ((deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                         &local_80);
            }
            uVar8 = (long)iVar3;
            if ((bVar11 && send_deficit) || (uVar8 = uVar7, iVar3 == local_9c)) {
              puVar2 = (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + uVar8;
              *puVar2 = *puVar2 + lVar9;
            }
            plVar5 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar4 = plVar5[uVar7];
          }
        }
      }
      else if ((local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second < 1) {
        while (0 < lVar4) {
          if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
            local_b0.first = iVar6;
            local_b0.second = lVar4;
            std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            emplace_back<std::pair<int,long>>
                      ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_80,
                       &local_b0);
            break;
          }
          lVar10 = -(local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
          if (lVar4 < -(local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second) {
            lVar10 = lVar4;
          }
          iVar3 = (local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
          plVar5[uVar7] = lVar4 - lVar10;
          plVar1 = &(local_80._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
          *plVar1 = *plVar1 + lVar10;
          if (*plVar1 == 0) {
            std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::pop_front
                      ((deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                       &local_80);
          }
          uVar8 = (long)iVar3;
          if ((uVar7 == local_90) || (uVar8 = uVar7, iVar3 == local_9c && send_deficit)) {
            puVar2 = (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar8;
            *puVar2 = *puVar2 + lVar10;
          }
          plVar5 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar4 = plVar5[uVar7];
        }
      }
      else {
        local_b0.first = iVar6;
        local_b0.second = lVar4;
        std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
        emplace_back<std::pair<int,long>>
                  ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_80,
                   &local_b0);
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

inline std::vector<size_t> surplus_send_pairing(std::vector<signed_size_t>& surpluses, int p, int rank, bool send_deficit = true) {
    // calculate the send and receive counts by a linear scan over
    // the surpluses, using a queue to keep track of all surpluses
    std::vector<size_t> send_counts(p, 0);
    std::queue<std::pair<int, signed_size_t> > fifo;
    for (int i = 0; i < p; ++i) {
        if (surpluses[i] == 0)
            continue;
        if (fifo.empty()) {
            fifo.push(std::make_pair(i, surpluses[i]));
        } else if (surpluses[i] > 0) {
            if (fifo.front().second > 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] > 0 && !fifo.empty())
                {
                    long long min = std::min(surpluses[i], -fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] -= min;
                    fifo.front().second += min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i)
                        send_counts[j] += min;
                    else if (rank == j && send_deficit)
                        send_counts[i] += min;
                }
                if (surpluses[i] > 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        } else if (surpluses[i] < 0) {
            if (fifo.front().second < 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] < 0 && !fifo.empty())
                {
                    long long min = std::min(-surpluses[i], fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] += min;
                    fifo.front().second -= min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i && send_deficit)
                        send_counts[j] += min;
                    else if (rank == j)
                        send_counts[i] += min;
                }
                if (surpluses[i] < 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        }
    }
    MXX_ASSERT(fifo.empty());

    return send_counts;
}